

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

bool __thiscall World::PlayerOnline(World *this,string *username)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  list<Client_*,_std::allocator<Client_*>_> *plVar4;
  _List_node_base *p_Var5;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)username);
  bVar2 = Player::ValidName(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2) {
    plVar4 = &(this->server->super_Server).clients;
    p_Var5 = (_List_node_base *)plVar4;
    do {
      p_Var5 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var5->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      bVar2 = p_Var5 != (_List_node_base *)plVar4;
      if (p_Var5 == (_List_node_base *)plVar4) {
        return bVar2;
      }
      lVar1 = *(long *)((long)p_Var5[1]._M_next + 0x108);
    } while ((lVar1 == 0) ||
            (iVar3 = std::__cxx11::string::compare((string *)(lVar1 + 0x10)), iVar3 != 0));
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool World::PlayerOnline(std::string username)
{
	if (!Player::ValidName(username))
	{
		return false;
	}

	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			if (eoclient->player->username.compare(username) == 0)
			{
				return true;
			}
		}
	}

	return false;
}